

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_19::FieldValuePrinterWrapper::PrintBytes
          (FieldValuePrinterWrapper *this,string *val,BaseTextGenerator *generator)

{
  pointer pFVar1;
  string local_40;
  BaseTextGenerator *local_20;
  BaseTextGenerator *generator_local;
  string *val_local;
  FieldValuePrinterWrapper *this_local;
  
  local_20 = generator;
  generator_local = (BaseTextGenerator *)val;
  val_local = (string *)this;
  pFVar1 = std::
           unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ::operator->(&this->delegate_);
  (*pFVar1->_vptr_FieldValuePrinter[10])(&local_40,pFVar1,generator_local);
  TextFormat::BaseTextGenerator::PrintString(generator,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void PrintBytes(const std::string& val,
                  TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintBytes(val));
  }